

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_plot_function(nk_context *ctx,nk_chart_type type,void *userdata,
                     _func_float_void_ptr_int *value_getter,int count,int offset)

{
  int iVar1;
  nk_bool nVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float max_value;
  
  if (count != 0 && (value_getter != (_func_float_void_ptr_int *)0x0 && ctx != (nk_context *)0x0)) {
    fVar6 = (*value_getter)(userdata,offset);
    max_value = fVar6;
    iVar3 = offset;
    iVar1 = 0;
    iVar4 = 0;
    if (0 < count) {
      iVar1 = count;
      iVar4 = count;
    }
    while (iVar1 != 0) {
      fVar7 = (*value_getter)(userdata,iVar3);
      if (max_value <= fVar7) {
        max_value = fVar7;
      }
      if (fVar6 <= fVar7) {
        fVar7 = fVar6;
      }
      fVar6 = fVar7;
      iVar3 = iVar3 + 1;
      iVar1 = iVar1 + -1;
    }
    nVar2 = nk_chart_begin(ctx,type,count,fVar6,max_value);
    if (nVar2 != 0) {
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        fVar6 = (*value_getter)(userdata,offset);
        nk_chart_push(ctx,fVar6);
        offset = offset + 1;
      }
      nk_chart_end(ctx);
      return;
    }
  }
  return;
}

Assistant:

NK_API void
nk_plot_function(struct nk_context *ctx, enum nk_chart_type type, void *userdata,
float(*value_getter)(void* user, int index), int count, int offset)
{
int i = 0;
float min_value;
float max_value;

NK_ASSERT(ctx);
NK_ASSERT(value_getter);
if (!ctx || !value_getter || !count) return;

max_value = min_value = value_getter(userdata, offset);
for (i = 0; i < count; ++i) {
float value = value_getter(userdata, i + offset);
min_value = NK_MIN(value, min_value);
max_value = NK_MAX(value, max_value);
}

if (nk_chart_begin(ctx, type, count, min_value, max_value)) {
for (i = 0; i < count; ++i)
nk_chart_push(ctx, value_getter(userdata, i + offset));
nk_chart_end(ctx);
}
}